

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teststreamclient.cpp
# Opt level: O2

void test_deltaTimeInfo_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_wrap_stringstream<char> *this;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  basic_wrap_stringstream<char> local_208;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_210 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"test_deltaTimeInfo");
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_30 = (pbVar2->_M_dataplus)._M_p;
  local_28 = local_30 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x43);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_220 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"test_deltaTimeInfo");
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_40 = (pbVar2->_M_dataplus)._M_p;
  local_38 = local_40 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x43);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_230 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"test_deltaTimeInfo");
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_50 = (pbVar2->_M_dataplus)._M_p;
  local_48 = local_50 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x43);
  this = &local_208;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  test_deltaTimeInfo::test_method((test_deltaTimeInfo *)this);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_240 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"test_deltaTimeInfo");
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_60 = (pbVar2->_M_dataplus)._M_p;
  local_58 = local_60 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x43);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_250 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"test_deltaTimeInfo");
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_70 = (pbVar2->_M_dataplus)._M_p;
  local_68 = local_70 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x43);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE (test_deltaTimeInfo)
{
//	}
//		”params”: {
//			”samples”: <number>,
//			”delta”: {
//				"type": "ntp",
//				"era": <number>,
//				"seconds": <number>,
//				"fraction": <number>,
//				"subFraction": <number>
//			}
//		}
//	}

	hbm::streaming::deltaTimeInfo deltaTime;
	uint64_t timestamp;

	{
		Json::Value params;

		params["samples"] = 1;
		params["delta"]["type"] = "ntp";
		params["delta"]["seconds"] = 1;

		deltaTime.setDelta(params);
	}


	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==0);
	deltaTime.increment(1);
	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==(0x0100000000));
	deltaTime.increment(2);
	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==(0x0300000000));


	deltaTime.clear();
	{
		Json::Value params;

		params["samples"] = 1;
		params["delta"]["type"] = "ntp";
		params["delta"]["subFraction"] = 0x10000000;

		deltaTime.setDelta(params);
	}
	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==0);
	timestamp = deltaTime.increment(16);
	BOOST_CHECK(timestamp==(0x01));

	deltaTime.clear();
	{
		Json::Value params;

		params["samples"] = 2;
		params["delta"]["type"] = "ntp";
		params["delta"]["subFraction"] = 0x20000000;

		deltaTime.setDelta(params);
	}
	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==0);
	deltaTime.increment(16);
	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==(0x01));


	deltaTime.clear();
	{
		Json::Value params;

		params["samples"] = 2;
		params["delta"]["type"] = "ntp";
		params["delta"]["seconds"] = 1;

		deltaTime.setDelta(params);
	}
	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==0);
	deltaTime.increment(4);
	timestamp = deltaTime.ntpTimeStamp();
	BOOST_CHECK(timestamp==(0x0200000000));
}